

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O0

int write_to_data(void)

{
  bool bVar1;
  uint len;
  ostream *poVar2;
  undefined4 *puVar3;
  int data_len;
  
  bVar1 = bincmp(origin_bin + m_index,anon_var_dwarf_b263,6);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_b279);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0xf5;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  m_index = 6;
  file_chara = origin_bin[6];
  if ((origin_bin[6] != '\x7f') && (origin_bin[6] != -1)) {
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_b279);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0xf5;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  m_index = 7;
  bVar1 = bincmp(origin_bin + 7,"DATA:",5);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_b279);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0xf5;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  m_index = m_index + 5;
  len = find_str(origin_bin + m_index,"CODE:",file_size - m_index,5);
  if (len == 0xffffffff) {
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_b279);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0xf5;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  if (len == 0) {
    d_adr = get_memory(4,0,new_mid);
  }
  else {
    d_adr = get_memory(len,0,new_mid);
    if (d_adr == 0xffffffff) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xe0;
      __cxa_throw(puVar3,&int::typeinfo,0);
    }
    memcpy(data_ptr + d_adr,origin_bin + m_index,(long)(int)len);
    m_index = len + m_index;
  }
  return 1;
}

Assistant:

int write_to_data() {
	int data_len;
	if (!bincmp(origin_bin+m_index,LVM_SIGNE,BIN_HEAD_LEN))
	{
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else m_index = BIN_HEAD_LEN;
	//判断是不是库文件
	file_chara = *(origin_bin + m_index);
	if (!(file_chara == 0x7f || file_chara == 0xff)) {
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw LVM_BIN_READ_ERROR;
	}
	++m_index;
	if (!bincmp(origin_bin+m_index,LVM_DATA,BIN_DATA_LEN))
	{
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else m_index += BIN_DATA_LEN;
	data_len = find_str(origin_bin + m_index, LVM_CODE, file_size - m_index, BIN_CODE_LEN);
	if (data_len == -1){
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else
	{
		if (data_len == 0) {
			d_adr = get_memory(4, DataSegType, new_mid);
			return LVM_SUCCESS;
		}
		d_adr=get_memory(data_len, DataSegType,new_mid);
		if(d_adr!=-1) memcpy(data_ptr+d_adr, origin_bin + m_index, data_len);
		else throw LVM_DATA_GET_ERROR;
	}
	m_index += data_len;
	return LVM_SUCCESS;
}